

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

int __thiscall
QMultiMap<Qt::GestureType,_QGestureRecognizer_*>::remove
          (QMultiMap<Qt::GestureType,_QGestureRecognizer_*> *this,char *__filename)

{
  bool bVar1;
  size_type sVar2;
  QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>
  *this_00;
  size_type sVar3;
  size_type_conflict result;
  MapData *newData;
  Key *in_stack_00000038;
  Map *in_stack_00000040;
  QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>
  *in_stack_00000048;
  key_type *in_stack_ffffffffffffffb8;
  multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>
  *in_stack_ffffffffffffffc0;
  undefined4 local_8;
  
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_>
                      *)0x30be61);
  if (bVar1) {
    bVar1 = QtPrivate::
            QExplicitlySharedDataPointerV2<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_>
            ::isShared((QExplicitlySharedDataPointerV2<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_>
                        *)in_stack_ffffffffffffffc0);
    if (bVar1) {
      this_00 = (QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>
                 *)operator_new(0x38);
      QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>
      ::QMapData(this_00);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_>
      ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_>
                    *)0x30bed8);
      sVar3 = QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>
              ::copyIfNotEquivalentTo(in_stack_00000048,in_stack_00000040,in_stack_00000038);
      local_8 = (int)sVar3;
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_>
      ::reset(&this->d,this_00);
    }
    else {
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_>
      ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_>
                    *)0x30be8b);
      sVar2 = std::
              multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>
              ::erase(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      local_8 = (int)sVar2;
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_type remove(const Key &key)
    {
        if (!d)
            return 0;

        if (!d.isShared())
            return size_type(d->m.erase(key));

        MapData *newData = new MapData;
        size_type result = newData->copyIfNotEquivalentTo(d->m, key);

        d.reset(newData);

        return result;
    }